

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor_op.hpp
# Opt level: O0

void asio::detail::
     executor_op<asio::detail::binder0<std::function<void_()>_>,_std::allocator<void>,_asio::detail::scheduler_operation>
     ::do_complete(void *owner,scheduler_operation *base,error_code *param_3,size_t param_4)

{
  std_fenced_block local_7d [8];
  fenced_block b;
  undefined1 local_70 [8];
  binder0<std::function<void_()>_> handler;
  ptr p;
  allocator<void> allocator;
  executor_op<asio::detail::binder0<std::function<void_()>_>,_std::allocator<void>,_asio::detail::scheduler_operation>
  *o;
  size_t param_3_local;
  error_code *param_2_local;
  scheduler_operation *base_local;
  void *owner_local;
  
  handler.handler_._M_invoker = (_Invoker_type)((long)&p.p + 7);
  p.a = (allocator<void> *)base;
  p.v = base;
  binder0<std::function<void_()>_>::binder0
            ((binder0<std::function<void_()>_> *)local_70,
             (binder0<std::function<void_()>_> *)(base + 1));
  ptr::reset((ptr *)&handler.handler_._M_invoker);
  if (owner != (void *)0x0) {
    std_fenced_block::std_fenced_block(local_7d,half);
    asio_handler_invoke_helpers::
    invoke<asio::detail::binder0<std::function<void()>>,asio::detail::binder0<std::function<void()>>>
              ((binder0<std::function<void_()>_> *)local_70,
               (binder0<std::function<void_()>_> *)local_70);
    std_fenced_block::~std_fenced_block(local_7d);
  }
  binder0<std::function<void_()>_>::~binder0((binder0<std::function<void_()>_> *)local_70);
  ptr::~ptr((ptr *)&handler.handler_._M_invoker);
  return;
}

Assistant:

static void do_complete(void* owner, Operation* base,
      const asio::error_code& /*ec*/,
      std::size_t /*bytes_transferred*/)
  {
    // Take ownership of the handler object.
    executor_op* o(static_cast<executor_op*>(base));
    Alloc allocator(o->allocator_);
    ptr p = { detail::addressof(allocator), o, o };

    ASIO_HANDLER_COMPLETION((*o));

    // Make a copy of the handler so that the memory can be deallocated before
    // the upcall is made. Even if we're not about to make an upcall, a
    // sub-object of the handler may be the true owner of the memory associated
    // with the handler. Consequently, a local copy of the handler is required
    // to ensure that any owning sub-object remains valid until after we have
    // deallocated the memory here.
    Handler handler(ASIO_MOVE_CAST(Handler)(o->handler_));
    p.reset();

    // Make the upcall if required.
    if (owner)
    {
      fenced_block b(fenced_block::half);
      ASIO_HANDLER_INVOCATION_BEGIN(());
      asio_handler_invoke_helpers::invoke(handler, handler);
      ASIO_HANDLER_INVOCATION_END;
    }
  }